

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pathtracer_device.cpp
# Opt level: O2

Vec3fa embree::ReflectiveMetalMaterial__sample
                 (ISPCReflectiveMetalMaterial *This,BRDF *brdf,Vec3fa *Lw,Vec3fa *wo,
                 DifferentialGeometry *dg,Sample3f *wi_o,Medium *medium,Vec2f *s)

{
  undefined8 uVar1;
  undefined8 uVar2;
  Vec3fa VVar3;
  Vec3fa VVar4;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_58;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_48;
  
  reflect((Vec3fa *)dg,&wi_o[2].v);
  *(ulong *)&(medium->transmission).field_0 = CONCAT44(fStack_64,local_68);
  *(ulong *)((long)&(medium->transmission).field_0 + 8) = CONCAT44(fStack_5c,fStack_60);
  medium->eta = 1.0;
  uVar1 = *(undefined8 *)&(brdf->Ka).field_0;
  uVar2 = *(undefined8 *)((long)&(brdf->Ka).field_0 + 8);
  local_48._0_8_ = *(undefined8 *)&(brdf->Kd).field_0;
  local_48._8_8_ = *(undefined8 *)((long)&(brdf->Kd).field_0 + 8);
  local_58._0_8_ = *(undefined8 *)&(brdf->Ks).field_0;
  local_58._8_8_ = *(undefined8 *)((long)&(brdf->Ks).field_0 + 8);
  VVar3 = fresnelConductor((embree *)&local_68,
                           (float)dg->primID * wi_o[2].v.field_0.m128[2] +
                           (float)dg->geomID * wi_o[2].v.field_0.m128[1] +
                           (float)dg->instIDs[0] * wi_o[2].v.field_0.m128[0],
                           (Vec3fa *)&local_48.field_1,(Vec3fa *)&local_58.field_1);
  local_78 = (float)uVar1;
  fStack_74 = (float)((ulong)uVar1 >> 0x20);
  fStack_70 = (float)uVar2;
  fStack_6c = (float)((ulong)uVar2 >> 0x20);
  VVar4.field_0._0_4_ = local_78 * local_68;
  VVar4.field_0._4_4_ = fStack_74 * fStack_64;
  (This->base).type = (int)VVar4.field_0._0_4_;
  (This->base).align[0] = (int)VVar4.field_0._4_4_;
  (This->base).align[1] = (int)(fStack_70 * fStack_60);
  (This->base).align[2] = (int)(fStack_6c * fStack_5c);
  VVar4.field_0._8_8_ = VVar3.field_0._8_8_;
  return (Vec3fa)VVar4.field_0;
}

Assistant:

Vec3fa ReflectiveMetalMaterial__sample(ISPCReflectiveMetalMaterial* This, const BRDF& brdf, const Vec3fa& Lw, const Vec3fa& wo, const DifferentialGeometry& dg, Sample3f& wi_o, Medium& medium, const Vec2f& s)
{
  wi_o = make_Sample3f(reflect(wo,dg.Ns),1.0f);
  return Vec3fa(This->reflectance) * fresnelConductor(dot(wo,dg.Ns),Vec3fa((Vec3fa)This->eta),Vec3fa((Vec3fa)This->k));
}